

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib.c
# Opt level: O2

_Bool zlib_decompress_block(ssh_decompressor *dc,uchar *block,int len,uchar **outblock,int *outlen)

{
  zlib_decompress_ctx *dctx;
  ssh_decompressor *nbitsp;
  ssh_decompressor *bitsp;
  ssh_decompressor *ztab;
  ssh_decompressor *ztab_00;
  uchar *lengths;
  ssh_decompressor *psVar1;
  int *piVar2;
  byte *pbVar3;
  short sVar4;
  ushort uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  int iVar9;
  uint uVar10;
  ssh_compression_alg *psVar11;
  uchar *puVar12;
  ushort uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  ssh_compression_alg *psVar18;
  
  if (dc[-1].vt != (ssh_compression_alg *)0x0) {
    __assert_fail("!dctx->outblk",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/zlib.c",
                  0x3e9,
                  "_Bool zlib_decompress_block(ssh_decompressor *, const unsigned char *, int, unsigned char **, int *)"
                 );
  }
  dctx = (zlib_decompress_ctx *)(dc + -0x1038);
  psVar11 = (ssh_compression_alg *)strbuf_new_nm();
  dc[-1].vt = psVar11;
  nbitsp = dc + -0x1002;
  bitsp = dc + -0x1003;
  ztab = dc + -0x1035;
  ztab_00 = dc + -0x1036;
  puVar12 = (uchar *)((long)&dc[-0x102c].vt + 7);
  lengths = (uchar *)((long)&dc[-0x102e].vt + 4);
switchD_0012f108_default:
  iVar9 = *(int *)&nbitsp->vt;
  if (iVar9 < 1 && len < 1) {
LAB_0012f7e8:
    psVar11 = dc[-1].vt;
    *outlen = *(int *)&psVar11->compress_new;
    puVar12 = (uchar *)strbuf_to_str((strbuf *)psVar11);
    *outblock = puVar12;
    dc[-1].vt = (ssh_compression_alg *)0x0;
    return true;
  }
  for (; (iVar9 < 0x18 && (0 < len)); len = len + -1) {
    bitsp->vt = (ssh_compression_alg *)
                ((ulong)bitsp->vt | (ulong)((uint)*block << ((byte)iVar9 & 0x1f)));
    block = block + 1;
    iVar9 = iVar9 + 8;
    *(int *)&nbitsp->vt = iVar9;
  }
  switch(*(undefined4 *)&dc[-0x1033].vt) {
  case 0:
    if (iVar9 < 0x10) goto LAB_0012f7e8;
    uVar13 = (ushort)bitsp->vt;
    uVar5 = uVar13 << 8;
    uVar13 = uVar5 | uVar13 >> 8;
    *(int *)&nbitsp->vt = iVar9 + -0x10;
    bitsp->vt = (ssh_compression_alg *)((ulong)bitsp->vt >> 0x10);
    if (((uVar13 % 0x1f != 0) || ((uVar13 & 0xf20) != 0x800)) || (0x7000 < (uVar5 & 0xf000)))
    goto LAB_0012f819;
    break;
  case 1:
    if (iVar9 < 3) goto LAB_0012f7e8;
    psVar11 = bitsp->vt;
    uVar10 = iVar9 - 3;
    *(uint *)&nbitsp->vt = uVar10;
    psVar18 = (ssh_compression_alg *)((ulong)psVar11 >> 3);
    bitsp->vt = psVar18;
    switch((uint)((ulong)psVar11 >> 1) & 3) {
    case 0:
      *(undefined4 *)&dc[-0x1033].vt = 10;
      *(uint *)&dc[-0x1002].vt = uVar10 & 0xfffffff8;
      dc[-0x1003].vt = (ssh_compression_alg *)((ulong)psVar18 >> ((byte)uVar10 & 7));
      break;
    case 1:
      uVar6 = *(undefined4 *)((long)&dc[-0x1038].vt + 4);
      uVar7 = *(undefined4 *)&dc[-0x1037].vt;
      uVar8 = *(undefined4 *)((long)&dc[-0x1037].vt + 4);
      *(undefined4 *)&dc[-0x1036].vt = *(undefined4 *)&dc[-0x1038].vt;
      *(undefined4 *)((long)&dc[-0x1036].vt + 4) = uVar6;
      *(undefined4 *)&dc[-0x1035].vt = uVar7;
      *(undefined4 *)((long)&dc[-0x1035].vt + 4) = uVar8;
      *(undefined4 *)&dc[-0x1033].vt = 6;
      break;
    case 2:
      *(undefined4 *)&dc[-0x1033].vt = 2;
    }
    goto switchD_0012f108_default;
  case 2:
    if (iVar9 < 0xe) goto LAB_0012f7e8;
    psVar11 = dc[-0x1003].vt;
    *(uint *)&dc[-0x1032].vt = ((uint)psVar11 & 0x1f) + 0x101;
    *(uint *)((long)&dc[-0x1032].vt + 4) = ((uint)((ulong)psVar11 >> 5) & 0x1f) + 1;
    *(uint *)&dc[-0x1031].vt = ((uint)((ulong)psVar11 >> 10) & 0xf) + 4;
    *(int *)&dc[-0x1002].vt = iVar9 + -0xe;
    dc[-0x1003].vt = (ssh_compression_alg *)((ulong)psVar11 >> 0xe);
    *(undefined4 *)((long)&dc[-0x1031].vt + 4) = 0;
    *(undefined4 *)&dc[-0x1033].vt = 3;
    lengths[0] = '\0';
    lengths[1] = '\0';
    lengths[2] = '\0';
    lengths[3] = '\0';
    lengths[4] = '\0';
    lengths[5] = '\0';
    lengths[6] = '\0';
    lengths[7] = '\0';
    *(undefined8 *)((long)&dc[-0x102d].vt + 4) = 0;
    *(undefined4 *)((long)&dc[-0x102c].vt + 3) = 0;
    goto switchD_0012f108_default;
  case 3:
    if (iVar9 < 3) goto LAB_0012f7e8;
    iVar16 = *(int *)&dc[-0x1031].vt;
    iVar15 = *(int *)((long)&dc[-0x1031].vt + 4);
    lVar17 = (long)iVar15;
    iVar14 = iVar16;
    if (iVar16 < iVar15) {
      iVar14 = iVar15;
    }
    while ((iVar15 = iVar14, lVar17 < iVar16 && (iVar15 = (int)lVar17, 2 < iVar9))) {
      psVar11 = dc[-0x1003].vt;
      *(int *)((long)&dc[-0x1031].vt + 4) = iVar15 + 1;
      pbVar3 = "\x10\x11\x12" + lVar17;
      lVar17 = lVar17 + 1;
      *(byte *)((long)dc + ((ulong)*pbVar3 - 0x816c)) = (byte)psVar11 & 7;
      iVar9 = iVar9 + -3;
      *(int *)&dc[-0x1002].vt = iVar9;
      dc[-0x1003].vt = (ssh_compression_alg *)((ulong)psVar11 >> 3);
    }
    if (iVar15 == iVar16) {
      psVar11 = (ssh_compression_alg *)zlib_mktable(lengths,0x13);
      dc[-0x1034].vt = psVar11;
      *(undefined4 *)&dc[-0x1033].vt = 4;
      *(undefined4 *)((long)&dc[-0x1031].vt + 4) = 0;
    }
    goto switchD_0012f108_default;
  case 4:
    if (*(int *)((long)&dc[-0x1031].vt + 4) <
        *(int *)((long)&dc[-0x1032].vt + 4) + *(int *)&dc[-0x1032].vt) {
      iVar9 = zlib_huflookup((unsigned_long *)bitsp,(int *)nbitsp,(zlib_table *)dc[-0x1034].vt);
      if (iVar9 == -2) goto LAB_0012f819;
      if (iVar9 == -1) goto LAB_0012f7e8;
      if (iVar9 < 0x10) {
        iVar16 = *(int *)((long)&dc[-0x1031].vt + 4);
        *(int *)((long)&dc[-0x1031].vt + 4) = iVar16 + 1;
        *(char *)((long)dc + (long)iVar16 + -0x8159) = (char)iVar9;
      }
      else {
        uVar10 = 0;
        iVar16 = (uint)(iVar9 != 0x11) * 4 + 3;
        if (iVar9 == 0x10) {
          iVar16 = 2;
        }
        *(int *)&dc[-0x1030].vt = iVar16;
        *(uint *)((long)&dc[-0x1030].vt + 4) = (uint)(iVar9 == 0x12) * 8 + 3;
        if ((iVar9 == 0x10) && (iVar9 = *(int *)((long)&dc[-0x1031].vt + 4), 0 < iVar9)) {
          uVar10 = (uint)puVar12[iVar9 - 1];
        }
        *(uint *)((long)&dc[-0x102f].vt + 4) = uVar10;
        *(undefined4 *)&dc[-0x1033].vt = 5;
      }
    }
    else {
      psVar11 = (ssh_compression_alg *)zlib_mktable(puVar12,*(int *)&dc[-0x1032].vt);
      dc[-0x1036].vt = psVar11;
      psVar11 = (ssh_compression_alg *)
                zlib_mktable(puVar12 + *(int *)&dc[-0x1032].vt,*(int *)((long)&dc[-0x1032].vt + 4));
      dc[-0x1035].vt = psVar11;
      zlib_freetable((zlib_table **)(dc + -0x1034));
      dc[-0x1034].vt = (ssh_compression_alg *)0x0;
      *(undefined4 *)&dc[-0x1033].vt = 6;
    }
    goto switchD_0012f108_default;
  case 5:
    iVar16 = *(int *)&dc[-0x1030].vt;
    if (iVar9 < iVar16) goto LAB_0012f7e8;
    iVar15 = (~(-1 << ((byte)iVar16 & 0x1f)) & (uint)dc[-0x1003].vt) +
             *(int *)((long)&dc[-0x1030].vt + 4);
    *(int *)&dc[-0x1002].vt = iVar9 - iVar16;
    dc[-0x1003].vt = (ssh_compression_alg *)((ulong)dc[-0x1003].vt >> ((byte)iVar16 & 0x3f));
    while ((0 < iVar15 &&
           (iVar9 = *(int *)((long)&dc[-0x1031].vt + 4),
           iVar9 < *(int *)((long)&dc[-0x1032].vt + 4) + *(int *)&dc[-0x1032].vt))) {
      *(undefined1 *)((long)dc + (long)iVar9 + -0x8159) = *(undefined1 *)((long)&dc[-0x102f].vt + 4)
      ;
      piVar2 = (int *)((long)&dc[-0x1031].vt + 4);
      *piVar2 = *piVar2 + 1;
      iVar15 = iVar15 + -1;
    }
    *(undefined4 *)&dc[-0x1033].vt = 4;
    goto switchD_0012f108_default;
  case 6:
    uVar10 = zlib_huflookup((unsigned_long *)bitsp,(int *)nbitsp,(zlib_table *)ztab_00->vt);
    if (uVar10 == 0xfffffffe) goto LAB_0012f819;
    if (uVar10 == 0xffffffff) goto LAB_0012f7e8;
    if ((int)uVar10 < 0x100) {
      zlib_emit_char(dctx,uVar10);
      goto switchD_0012f108_default;
    }
    if (uVar10 == 0x100) {
      *(undefined4 *)&dc[-0x1033].vt = 1;
      if (dc[-0x1036].vt != dc[-0x1038].vt) {
        zlib_freetable((zlib_table **)ztab_00);
        ztab_00->vt = (ssh_compression_alg *)0x0;
      }
      if (dc[-0x1035].vt != dc[-0x1037].vt) {
        zlib_freetable((zlib_table **)ztab);
        ztab->vt = (ssh_compression_alg *)0x0;
      }
      goto switchD_0012f108_default;
    }
    if (uVar10 < 0x11e) {
      *(undefined4 *)&dc[-0x1033].vt = 7;
      *(uint *)((long)&dc[-0x1033].vt + 4) = uVar10;
      goto switchD_0012f108_default;
    }
    goto LAB_0012f819;
  case 7:
    lVar17 = (long)*(int *)((long)&dc[-0x1033].vt + 4) * 0xc;
    sVar4 = *(short *)("void ssh2_transport_reconfigure(PacketProtocolLayer *, Conf *)" +
                      lVar17 + 0xe);
    if (iVar9 < sVar4) goto LAB_0012f7e8;
    *(uint *)&dc[-0x102f].vt =
         (~(-1 << ((byte)sVar4 & 0x1f)) & (uint)dc[-0x1003].vt) +
         *(int *)("void ssh2_transport_reconfigure(PacketProtocolLayer *, Conf *)" + lVar17 + 0x10);
    *(int *)&dc[-0x1002].vt = iVar9 - sVar4;
    dc[-0x1003].vt = (ssh_compression_alg *)((ulong)dc[-0x1003].vt >> ((byte)sVar4 & 0x3f));
    *(undefined4 *)&dc[-0x1033].vt = 8;
    goto switchD_0012f108_default;
  case 8:
    iVar9 = zlib_huflookup((unsigned_long *)bitsp,(int *)nbitsp,(zlib_table *)ztab->vt);
    if (iVar9 == -1) goto LAB_0012f7e8;
    if ((iVar9 != -2) && (iVar9 < 0x1e)) {
      *(undefined4 *)&dc[-0x1033].vt = 9;
      *(int *)((long)&dc[-0x1033].vt + 4) = iVar9;
      goto switchD_0012f108_default;
    }
LAB_0012f819:
    *outblock = (uchar *)0x0;
    *outlen = 0;
    return false;
  case 9:
    iVar16 = *(int *)((long)&dc[-0x1033].vt + 4);
    sVar4 = distcodes[iVar16].extrabits;
    if (iVar9 < sVar4) goto LAB_0012f7e8;
    psVar11 = dc[-0x1003].vt;
    *(int *)&dc[-0x1002].vt = iVar9 - sVar4;
    dc[-0x1003].vt = (ssh_compression_alg *)((ulong)psVar11 >> ((byte)sVar4 & 0x3f));
    *(undefined4 *)&dc[-0x1033].vt = 6;
    iVar9 = distcodes[iVar16].min;
    while( true ) {
      psVar1 = dc + -0x102f;
      iVar16 = *(int *)&psVar1->vt;
      *(int *)&psVar1->vt = *(int *)&psVar1->vt + -1;
      if (iVar16 == 0) break;
      zlib_emit_char(dctx,(uint)*(byte *)((long)dc +
                                         ((ulong)(*(int *)((long)&dc[-2].vt + 4) -
                                                  ((~(-1 << ((byte)sVar4 & 0x1f)) & (uint)psVar11) +
                                                  iVar9) & 0x7fff) - 0x800c)));
    }
    goto switchD_0012f108_default;
  case 10:
    if (iVar9 < 0x10) goto LAB_0012f7e8;
    *(uint *)&dc[-0x102e].vt = (uint)dc[-0x1003].vt & 0xffff;
    *(int *)&dc[-0x1002].vt = iVar9 + -0x10;
    dc[-0x1003].vt = (ssh_compression_alg *)((ulong)dc[-0x1003].vt >> 0x10);
    *(undefined4 *)&dc[-0x1033].vt = 0xb;
    goto switchD_0012f108_default;
  case 0xb:
    if (iVar9 < 0x10) goto LAB_0012f7e8;
    psVar11 = dc[-0x1003].vt;
    *(int *)&dc[-0x1002].vt = iVar9 + -0x10;
    dc[-0x1003].vt = (ssh_compression_alg *)((ulong)psVar11 >> 0x10);
    if (((uint)psVar11 & 0xffff ^ *(uint *)&dc[-0x102e].vt) != 0xffff) goto LAB_0012f819;
    if (*(uint *)&dc[-0x102e].vt != 0) {
      *(undefined4 *)&dc[-0x1033].vt = 0xc;
      goto switchD_0012f108_default;
    }
    break;
  case 0xc:
    if (iVar9 < 8) goto LAB_0012f7e8;
    zlib_emit_char(dctx,(uint)*(byte *)&dc[-0x1003].vt);
    *(int *)&dc[-0x1002].vt = *(int *)&dc[-0x1002].vt + -8;
    dc[-0x1003].vt = (ssh_compression_alg *)((ulong)dc[-0x1003].vt >> 8);
    psVar1 = dc + -0x102e;
    *(int *)&psVar1->vt = *(int *)&psVar1->vt + -1;
    if (*(int *)&psVar1->vt != 0) goto switchD_0012f108_default;
    break;
  default:
    goto switchD_0012f108_default;
  }
  *(undefined4 *)&dc[-0x1033].vt = 1;
  goto switchD_0012f108_default;
}

Assistant:

bool zlib_decompress_block(ssh_decompressor *dc,
                           const unsigned char *block, int len,
                           unsigned char **outblock, int *outlen)
{
    struct zlib_decompress_ctx *dctx =
        container_of(dc, struct zlib_decompress_ctx, dc);
    const coderecord *rec;
    int code, blktype, rep, dist, nlen, header;
    static const unsigned char lenlenmap[] = {
        16, 17, 18, 0, 8, 7, 9, 6, 10, 5, 11, 4, 12, 3, 13, 2, 14, 1, 15
    };

    assert(!dctx->outblk);
    dctx->outblk = strbuf_new_nm();

    while (len > 0 || dctx->nbits > 0) {
        while (dctx->nbits < 24 && len > 0) {
            dctx->bits |= (*block++) << dctx->nbits;
            dctx->nbits += 8;
            len--;
        }
        switch (dctx->state) {
          case START:
            /* Expect 16-bit zlib header. */
            if (dctx->nbits < 16)
                goto finished;         /* done all we can */

            /*
             * The header is stored as a big-endian 16-bit integer,
             * in contrast to the general little-endian policy in
             * the rest of the format :-(
             */
            header = (((dctx->bits & 0xFF00) >> 8) |
                      ((dctx->bits & 0x00FF) << 8));
            EATBITS(16);

            /*
             * Check the header:
             *
             *  - bits 8-11 should be 1000 (Deflate/RFC1951)
             *  - bits 12-15 should be at most 0111 (window size)
             *  - bit 5 should be zero (no dictionary present)
             *  - we don't care about bits 6-7 (compression rate)
             *  - bits 0-4 should be set up to make the whole thing
             *    a multiple of 31 (checksum).
             */
            if ((header & 0x0F00) != 0x0800 ||
                (header & 0xF000) >  0x7000 ||
                (header & 0x0020) != 0x0000 ||
                (header % 31) != 0)
                goto decode_error;

            dctx->state = OUTSIDEBLK;
            break;
          case OUTSIDEBLK:
            /* Expect 3-bit block header. */
            if (dctx->nbits < 3)
                goto finished;         /* done all we can */
            EATBITS(1);
            blktype = dctx->bits & 3;
            EATBITS(2);
            if (blktype == 0) {
                int to_eat = dctx->nbits & 7;
                dctx->state = UNCOMP_LEN;
                EATBITS(to_eat);       /* align to byte boundary */
            } else if (blktype == 1) {
                dctx->currlentable = dctx->staticlentable;
                dctx->currdisttable = dctx->staticdisttable;
                dctx->state = INBLK;
            } else if (blktype == 2) {
                dctx->state = TREES_HDR;
            }
            break;
          case TREES_HDR:
            /*
             * Dynamic block header. Five bits of HLIT, five of
             * HDIST, four of HCLEN.
             */
            if (dctx->nbits < 5 + 5 + 4)
                goto finished;         /* done all we can */
            dctx->hlit = 257 + (dctx->bits & 31);
            EATBITS(5);
            dctx->hdist = 1 + (dctx->bits & 31);
            EATBITS(5);
            dctx->hclen = 4 + (dctx->bits & 15);
            EATBITS(4);
            dctx->lenptr = 0;
            dctx->state = TREES_LENLEN;
            memset(dctx->lenlen, 0, sizeof(dctx->lenlen));
            break;
          case TREES_LENLEN:
            if (dctx->nbits < 3)
                goto finished;
            while (dctx->lenptr < dctx->hclen && dctx->nbits >= 3) {
                dctx->lenlen[lenlenmap[dctx->lenptr++]] =
                    (unsigned char) (dctx->bits & 7);
                EATBITS(3);
            }
            if (dctx->lenptr == dctx->hclen) {
                dctx->lenlentable = zlib_mktable(dctx->lenlen, 19);
                dctx->state = TREES_LEN;
                dctx->lenptr = 0;
            }
            break;
          case TREES_LEN:
            if (dctx->lenptr >= dctx->hlit + dctx->hdist) {
                dctx->currlentable = zlib_mktable(dctx->lengths, dctx->hlit);
                dctx->currdisttable = zlib_mktable(dctx->lengths + dctx->hlit,
                                                  dctx->hdist);
                zlib_freetable(&dctx->lenlentable);
                dctx->lenlentable = NULL;
                dctx->state = INBLK;
                break;
            }
            code =
                zlib_huflookup(&dctx->bits, &dctx->nbits, dctx->lenlentable);
            if (code == -1)
                goto finished;
            if (code == -2)
                goto decode_error;
            if (code < 16)
                dctx->lengths[dctx->lenptr++] = code;
            else {
                dctx->lenextrabits = (code == 16 ? 2 : code == 17 ? 3 : 7);
                dctx->lenaddon = (code == 18 ? 11 : 3);
                dctx->lenrep = (code == 16 && dctx->lenptr > 0 ?
                               dctx->lengths[dctx->lenptr - 1] : 0);
                dctx->state = TREES_LENREP;
            }
            break;
          case TREES_LENREP:
            if (dctx->nbits < dctx->lenextrabits)
                goto finished;
            rep =
                dctx->lenaddon +
                (dctx->bits & ((1 << dctx->lenextrabits) - 1));
            EATBITS(dctx->lenextrabits);
            while (rep > 0 && dctx->lenptr < dctx->hlit + dctx->hdist) {
                dctx->lengths[dctx->lenptr] = dctx->lenrep;
                dctx->lenptr++;
                rep--;
            }
            dctx->state = TREES_LEN;
            break;
          case INBLK:
            code =
                zlib_huflookup(&dctx->bits, &dctx->nbits, dctx->currlentable);
            if (code == -1)
                goto finished;
            if (code == -2)
                goto decode_error;
            if (code < 256)
                zlib_emit_char(dctx, code);
            else if (code == 256) {
                dctx->state = OUTSIDEBLK;
                if (dctx->currlentable != dctx->staticlentable) {
                    zlib_freetable(&dctx->currlentable);
                    dctx->currlentable = NULL;
                }
                if (dctx->currdisttable != dctx->staticdisttable) {
                    zlib_freetable(&dctx->currdisttable);
                    dctx->currdisttable = NULL;
                }
            } else if (code < 286) {
                dctx->state = GOTLENSYM;
                dctx->sym = code;
            } else {
                /* literal/length symbols 286 and 287 are invalid */
                goto decode_error;
            }
            break;
          case GOTLENSYM:
            rec = &lencodes[dctx->sym - 257];
            if (dctx->nbits < rec->extrabits)
                goto finished;
            dctx->len =
                rec->min + (dctx->bits & ((1 << rec->extrabits) - 1));
            EATBITS(rec->extrabits);
            dctx->state = GOTLEN;
            break;
          case GOTLEN:
            code =
                zlib_huflookup(&dctx->bits, &dctx->nbits,
                               dctx->currdisttable);
            if (code == -1)
                goto finished;
            if (code == -2)
                goto decode_error;
            if (code >= 30)            /* dist symbols 30 and 31 are invalid */
                goto decode_error;
            dctx->state = GOTDISTSYM;
            dctx->sym = code;
            break;
          case GOTDISTSYM:
            rec = &distcodes[dctx->sym];
            if (dctx->nbits < rec->extrabits)
                goto finished;
            dist = rec->min + (dctx->bits & ((1 << rec->extrabits) - 1));
            EATBITS(rec->extrabits);
            dctx->state = INBLK;
            while (dctx->len--)
                zlib_emit_char(dctx, dctx->window[(dctx->winpos - dist) &
                                                  (WINSIZE - 1)]);
            break;
          case UNCOMP_LEN:
            /*
             * Uncompressed block. We expect to see a 16-bit LEN.
             */
            if (dctx->nbits < 16)
                goto finished;
            dctx->uncomplen = dctx->bits & 0xFFFF;
            EATBITS(16);
            dctx->state = UNCOMP_NLEN;
            break;
          case UNCOMP_NLEN:
            /*
             * Uncompressed block. We expect to see a 16-bit NLEN,
             * which should be the one's complement of the previous
             * LEN.
             */
            if (dctx->nbits < 16)
                goto finished;
            nlen = dctx->bits & 0xFFFF;
            EATBITS(16);
            if (dctx->uncomplen != (nlen ^ 0xFFFF))
                goto decode_error;
            if (dctx->uncomplen == 0)
                dctx->state = OUTSIDEBLK;       /* block is empty */
            else
                dctx->state = UNCOMP_DATA;
            break;
          case UNCOMP_DATA:
            if (dctx->nbits < 8)
                goto finished;
            zlib_emit_char(dctx, dctx->bits & 0xFF);
            EATBITS(8);
            if (--dctx->uncomplen == 0)
                dctx->state = OUTSIDEBLK;       /* end of uncompressed block */
            break;
        }
    }

  finished:
    *outlen = dctx->outblk->len;
    *outblock = (unsigned char *)strbuf_to_str(dctx->outblk);
    dctx->outblk = NULL;
    return true;

  decode_error:
    *outblock = NULL;
    *outlen = 0;
    return false;
}